

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O1

char * __thiscall
MemoryLeakDetector::reallocMemory
          (MemoryLeakDetector *this,TestMemoryAllocator *allocator,char *memory,size_t size,
          char *file,int line,bool allocatNodesSeperately)

{
  MemoryLeakFailure *reporter;
  MemoryLeakDetectorNode *node;
  TestMemoryAllocator *allocAllocator;
  char *pcVar1;
  
  if (memory != (char *)0x0) {
    node = MemoryLeakDetectorTable::removeNode(&this->memoryTable_,memory);
    if (node == (MemoryLeakDetectorNode *)0x0) {
      reporter = this->reporter_;
      allocAllocator = NullUnknownAllocator::defaultAllocator();
      MemoryLeakOutputStringBuffer::reportFailure
                (&this->outputBuffer_,"Deallocating non-allocated memory\n","<unknown>",0,0,
                 allocAllocator,file,line,allocator,reporter);
      return (char *)0x0;
    }
    checkForCorruption(this,node,file,line,allocator,allocatNodesSeperately);
  }
  pcVar1 = reallocateMemoryAndLeakInformation
                     (this,allocator,memory,size,file,line,allocatNodesSeperately);
  return pcVar1;
}

Assistant:

char* MemoryLeakDetector::reallocMemory(TestMemoryAllocator* allocator, char* memory, size_t size, const char* file, int line, bool allocatNodesSeperately)
{
    if (memory) {
        MemoryLeakDetectorNode* node = memoryTable_.removeNode(memory);
        if (node == NULL) {
            outputBuffer_.reportDeallocateNonAllocatedMemoryFailure(file, line, allocator, reporter_);
            return NULL;
        }
        checkForCorruption(node, file, line, allocator, allocatNodesSeperately);
    }
    return reallocateMemoryAndLeakInformation(allocator, memory, size, file, line, allocatNodesSeperately);
}